

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O1

StringRef __thiscall
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::consumeOneOption
          (format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *this,StringRef *Style,
          char Indicator,StringRef Default)

{
  char cVar1;
  char cVar2;
  long lVar3;
  void *pvVar4;
  ulong uVar5;
  char *pcVar6;
  undefined7 in_register_00000011;
  char *pcVar7;
  char *__s;
  char *pcVar8;
  ulong __n;
  bool bVar9;
  StringRef SVar10;
  
  pcVar7 = (char *)CONCAT71(in_register_00000011,Indicator);
  pcVar6 = Default.Data;
  if ((*(long *)(this + 8) != 0) && (**(char **)this == (char)Style)) {
    *(char **)this = *(char **)this + 1;
    lVar3 = *(long *)(this + 8) + -1;
    *(long *)(this + 8) = lVar3;
    if (lVar3 == 0) {
      __assert_fail("false && \"Invalid range style\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0x170,
                    "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                   );
    }
    __n = *(ulong *)(this + 8);
    bVar9 = false;
    lVar3 = 0;
    __s = *(char **)this;
    do {
      if (__n == 0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                      ,0x9b,"char llvm::StringRef::front() const");
      }
      cVar1 = *__s;
      cVar2 = **(char **)((long)&DAT_01098b80 + lVar3);
      pcVar8 = __s;
      if (cVar1 == cVar2) {
        pvVar4 = memchr(__s,(int)(*(char **)((long)&DAT_01098b80 + lVar3))[1],__n);
        if ((pvVar4 == (void *)0x0) ||
           (uVar5 = (long)pvVar4 - (long)__s, uVar5 == 0xffffffffffffffff)) {
          __assert_fail("false && \"Missing range option end delimeter!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                        ,0x179,
                        "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                       );
        }
        if (__n <= uVar5) {
          __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                        ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
        }
        pcVar8 = __s + uVar5 + 1;
        pcVar6 = (char *)((uVar5 - 1) + (ulong)(uVar5 == 0));
        pcVar7 = __s + 1;
        __n = __n - (uVar5 + 1);
        *(char **)this = pcVar8;
        *(ulong *)(this + 8) = __n;
      }
      if (cVar1 == cVar2) break;
      lVar3 = lVar3 + 8;
      bVar9 = lVar3 == 0x18;
      __s = pcVar8;
    } while (!bVar9);
    if (bVar9) {
      __assert_fail("false && \"Invalid range style!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0x180,
                    "static StringRef llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::consumeOneOption(StringRef &, char, StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
                   );
    }
  }
  SVar10.Length = (size_t)pcVar6;
  SVar10.Data = pcVar7;
  return SVar10;
}

Assistant:

static StringRef consumeOneOption(StringRef &Style, char Indicator,
                                    StringRef Default) {
    if (Style.empty())
      return Default;
    if (Style.front() != Indicator)
      return Default;
    Style = Style.drop_front();
    if (Style.empty()) {
      assert(false && "Invalid range style");
      return Default;
    }

    for (const char *D : {"[]", "<>", "()"}) {
      if (Style.front() != D[0])
        continue;
      size_t End = Style.find_first_of(D[1]);
      if (End == StringRef::npos) {
        assert(false && "Missing range option end delimeter!");
        return Default;
      }
      StringRef Result = Style.slice(1, End);
      Style = Style.drop_front(End + 1);
      return Result;
    }
    assert(false && "Invalid range style!");
    return Default;
  }